

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

Marray<float,_std::allocator<unsigned_long>_> * __thiscall
andres::Marray<float,std::allocator<unsigned_long>>::operator=
          (Marray<float,std::allocator<unsigned_long>> *this,
          ViewExpression<andres::BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Times<float,_float,_float>_>,_float>
          *expression)

{
  CoordinateOrder CVar1;
  View<float,_true,_std::allocator<unsigned_long>_> *this_00;
  long lVar2;
  bool bVar3;
  float *pfVar4;
  size_t sVar5;
  runtime_error *this_01;
  long lVar6;
  undefined8 *puVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  Marray<float,_std::allocator<unsigned_long>_> m;
  allocator_type local_61;
  Marray<float,_std::allocator<unsigned_long>_> local_60;
  
  bVar3 = BinaryViewExpressionScalarSecond<andres::View<float,true,std::allocator<unsigned_long>>,float,float,andres::marray_detail::Times<float,float,float>>
          ::overlaps<float,false,std::allocator<unsigned_long>>
                    ((BinaryViewExpressionScalarSecond<andres::View<float,true,std::allocator<unsigned_long>>,float,float,andres::marray_detail::Times<float,float,float>>
                      *)expression,(View<float,_false,_std::allocator<unsigned_long>_> *)this);
  if (bVar3) {
    Marray<andres::BinaryViewExpressionScalarSecond<andres::View<float,true,std::allocator<unsigned_long>>,float,float,andres::marray_detail::Times<float,float,float>>,float>
              ((Marray<float,std::allocator<unsigned_long>> *)&local_60,expression,&local_61);
    Marray<float,_std::allocator<unsigned_long>_>::operator=
              ((Marray<float,_std::allocator<unsigned_long>_> *)this,&local_60);
    operator_delete(local_60.super_View<float,_false,_std::allocator<unsigned_long>_>.data_,
                    local_60.super_View<float,_false,_std::allocator<unsigned_long>_>.geometry_.
                    size_ << 2);
    operator_delete(local_60.super_View<float,_false,_std::allocator<unsigned_long>_>.geometry_.
                    shape_,local_60.super_View<float,_false,_std::allocator<unsigned_long>_>.
                           geometry_.dimension_ * 0x18);
    return (Marray<float,_std::allocator<unsigned_long>_> *)this;
  }
  if (*(long *)(this + 0x30) != *(long *)(*(long *)expression + 0x30)) {
    operator_delete(*(void **)this,*(long *)(this + 0x30) << 2);
    pfVar4 = __gnu_cxx::new_allocator<float>::allocate
                       ((new_allocator<float> *)(this + 0x40),
                        *(size_type *)(*(long *)expression + 0x30),(void *)0x0);
    *(float **)this = pfVar4;
  }
  sVar5 = BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Times<float,_float,_float>_>
          ::dimension((BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Times<float,_float,_float>_>
                       *)expression);
  marray_detail::Geometry<std::allocator<unsigned_long>_>::resize
            ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),sVar5);
  sVar5 = BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Times<float,_float,_float>_>
          ::dimension((BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Times<float,_float,_float>_>
                       *)expression);
  if (sVar5 != 0) {
    uVar10 = 0;
    do {
      sVar5 = View<float,_true,_std::allocator<unsigned_long>_>::shape
                        (*(View<float,_true,_std::allocator<unsigned_long>_> **)expression,uVar10);
      if (*(ulong *)(this + 0x28) <= uVar10) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"Assertion failed.");
        goto LAB_00148990;
      }
      *(size_t *)(*(long *)(this + 0x10) + uVar10 * 8) = sVar5;
      uVar10 = uVar10 + 1;
      sVar5 = BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Times<float,_float,_float>_>
              ::dimension((BinaryViewExpressionScalarSecond<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_float,_andres::marray_detail::Times<float,_float,_float>_>
                           *)expression);
    } while (uVar10 < sVar5);
  }
  this_00 = *(View<float,_true,_std::allocator<unsigned_long>_> **)expression;
  *(size_t *)(this + 0x30) = (this_00->geometry_).size_;
  this[0x3c] = (Marray<float,std::allocator<unsigned_long>>)0x1;
  View<float,_true,_std::allocator<unsigned_long>_>::testInvariant(this_00);
  CVar1 = (this_00->geometry_).coordinateOrder_;
  *(CoordinateOrder *)(this + 0x38) = CVar1;
  lVar6 = *(long *)(this + 0x28);
  if (lVar6 == 0) goto LAB_0014895c;
  lVar2 = *(long *)(this + 0x10);
  puVar7 = *(undefined8 **)(this + 0x18);
  if (CVar1 == FirstMajorOrder) {
    puVar7[lVar6 + -1] = 1;
    if (lVar6 != 1) {
      lVar8 = 1;
      do {
        lVar8 = lVar8 * *(long *)(lVar2 + -8 + lVar6 * 8);
        puVar7[lVar6 + -2] = lVar8;
        lVar6 = lVar6 + -1;
      } while (lVar6 != 1);
      goto LAB_001488f4;
    }
    uVar10 = *(ulong *)(this + 0x28);
    if (uVar10 == 0) goto LAB_001489a6;
    puVar7 = *(undefined8 **)(this + 0x20);
LAB_00148934:
    puVar7[uVar10 - 1] = 1;
    if (1 < uVar10) {
      lVar6 = 1;
      do {
        lVar6 = lVar6 * *(long *)(lVar2 + -8 + uVar10 * 8);
        puVar7[uVar10 - 2] = lVar6;
        uVar10 = uVar10 - 1;
      } while (uVar10 != 1);
    }
  }
  else {
    *puVar7 = 1;
    if (lVar6 == 1) {
      uVar10 = *(ulong *)(this + 0x28);
      if (uVar10 == 0) goto LAB_001489a6;
      puVar7 = *(undefined8 **)(this + 0x20);
    }
    else {
      lVar8 = 1;
      lVar9 = 0;
      do {
        lVar8 = lVar8 * *(long *)(lVar2 + lVar9 * 8);
        puVar7[lVar9 + 1] = lVar8;
        lVar9 = lVar9 + 1;
      } while (lVar6 + -1 != lVar9);
LAB_001488f4:
      uVar10 = *(ulong *)(this + 0x28);
      if (uVar10 == 0) {
LAB_001489a6:
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"Assertion failed.");
LAB_00148990:
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      puVar7 = *(undefined8 **)(this + 0x20);
      if (CVar1 == FirstMajorOrder) goto LAB_00148934;
    }
    *puVar7 = 1;
    if (1 < uVar10) {
      lVar6 = 1;
      lVar8 = 0;
      do {
        lVar6 = lVar6 * *(long *)(lVar2 + lVar8 * 8);
        puVar7[lVar8 + 1] = lVar6;
        lVar8 = lVar8 + 1;
      } while (uVar10 - 1 != lVar8);
    }
  }
LAB_0014895c:
  marray_detail::
  operate<andres::marray_detail::Assign<float,float>,float,std::allocator<unsigned_long>,andres::BinaryViewExpressionScalarSecond<andres::View<float,true,std::allocator<unsigned_long>>,float,float,andres::marray_detail::Times<float,float,float>>,float>
            (this,expression);
  return (Marray<float,_std::allocator<unsigned_long>_> *)this;
}

Assistant:

inline Marray<T, A>&
Marray<T, A>::operator=
(
    const ViewExpression<E, Te>& expression
)
{
    if(expression.overlaps(*this)) {
        Marray<T, A> m(expression); // temporary copy
        (*this) = m; // recursive call
    }
    else {
        // re-allocate memory (if necessary)
        if(this->size() != expression.size()) {
            dataAllocator_.deallocate(this->data_, this->size());
            this->data_ = dataAllocator_.allocate(expression.size());
        }
        
        // copy geometry
        this->geometry_.resize(expression.dimension());
        for(std::size_t j=0; j<expression.dimension(); ++j) {
            this->geometry_.shape(j) = expression.shape(j);
        }
        this->geometry_.size() = expression.size();
        this->geometry_.isSimple() = true;
        this->geometry_.coordinateOrder() = expression.coordinateOrder();
        if(this->geometry_.dimension() != 0) {
            marray_detail::stridesFromShape(this->geometry_.shapeBegin(), this->geometry_.shapeEnd(),
                this->geometry_.shapeStridesBegin(), this->geometry_.coordinateOrder());
            marray_detail::stridesFromShape(this->geometry_.shapeBegin(), this->geometry_.shapeEnd(),
                this->geometry_.stridesBegin(), this->geometry_.coordinateOrder());
        }
        
        // copy data
        marray_detail::operate(*this, expression, marray_detail::Assign<T, Te>());
    }
    return *this;
}